

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

value * __thiscall
mjs::anon_unknown_46::json_walk
          (value *__return_storage_ptr__,anon_unknown_46 *this,
          gc_heap_ptr<mjs::global_object> *global,value *reviver,object_ptr *holder,
          wstring_view name)

{
  gc_heap *h;
  pointer psVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined8 *puVar4;
  value *reviver_00;
  long *plVar5;
  object *this_00;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  pointer this_01;
  long lVar7;
  uint uVar8;
  initializer_list<mjs::value> __l;
  wstring_view in_stack_fffffffffffffeb8;
  wstring_view local_138;
  vector<mjs::string,_std::allocator<mjs::string>_> keys;
  wstring is;
  value new_element;
  value local_90;
  value val;
  wstring_view name_local;
  
  h = *(gc_heap **)this;
  name_local._M_len = (size_t)holder;
  puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)reviver);
  (**(code **)*puVar4)(&val,puVar4,&name_local);
  if (val.type_ == object) {
    reviver_00 = (value *)value::object_value(&val);
    bVar2 = is_array((object_ptr *)reviver_00);
    if (bVar2) {
      puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)reviver_00);
      is._M_dataplus._M_p = (pointer)0x6;
      is._M_string_length = 0x17b4f4;
      (**(code **)*puVar4)(&new_element,puVar4);
      uVar3 = to_uint32(&new_element);
      value::~value(&new_element);
      uVar6 = extraout_RDX;
      for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
        index_string_abi_cxx11_(&is,(mjs *)(ulong)uVar8,(uint32_t)uVar6);
        json_walk(&new_element,this,global,reviver_00,(object_ptr *)is._M_string_length,
                  in_stack_fffffffffffffeb8);
        if (new_element.type_ == undefined) {
          plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)reviver_00);
          keys.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)is._M_string_length;
          keys.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)is._M_dataplus._M_p;
          (**(code **)(*plVar5 + 0x10))(plVar5,(gc_heap_ptr_untyped *)&keys);
        }
        else {
          plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)reviver_00);
          local_138._M_str = is._M_dataplus._M_p;
          local_138._M_len = is._M_string_length;
          string::string((string *)&keys,h,&local_138);
          (**(code **)(*plVar5 + 8))(plVar5,(gc_heap_ptr_untyped *)&keys,&new_element,0);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&keys);
        }
        value::~value(&new_element);
        std::__cxx11::wstring::~wstring((wstring *)&is);
        uVar6 = extraout_RDX_00;
      }
    }
    else {
      this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)reviver_00);
      object::own_property_names(&keys,this_00,true);
      psVar1 = keys.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_01 = keys.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                     super__Vector_impl_data._M_start; this_01 != psVar1; this_01 = this_01 + 1) {
        new_element._0_16_ = string::view(this_01);
        std::__cxx11::wstring::
        wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                  ((wstring *)&is,
                   (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&new_element,
                   (allocator<wchar_t> *)&local_138);
        json_walk(&new_element,this,global,reviver_00,(object_ptr *)is._M_string_length,
                  in_stack_fffffffffffffeb8);
        if (new_element.type_ == undefined) {
          plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)reviver_00);
          local_138 = string::view(this_01);
          (**(code **)(*plVar5 + 0x10))(plVar5,&local_138);
        }
        else {
          plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)reviver_00);
          (**(code **)(*plVar5 + 8))(plVar5,this_01,&new_element,0);
        }
        value::~value(&new_element);
        std::__cxx11::wstring::~wstring((wstring *)&is);
      }
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&keys);
    }
  }
  value::value((value *)&is,(object_ptr *)reviver);
  string::string((string *)&local_138,h,&name_local);
  value::value(&new_element,(string *)&local_138);
  value::value(&local_90,&val);
  __l._M_len = 2;
  __l._M_array = &new_element;
  std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
            ((vector<mjs::value,_std::allocator<mjs::value>_> *)&keys,__l,
             (allocator_type *)&stack0xfffffffffffffec7);
  call_function(__return_storage_ptr__,(value *)global,(value *)&is,
                (vector<mjs::value,_std::allocator<mjs::value>_> *)&keys);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
            ((vector<mjs::value,_std::allocator<mjs::value>_> *)&keys);
  lVar7 = 0x28;
  do {
    value::~value((value *)((long)&new_element.type_ + lVar7));
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -0x28);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_138);
  value::~value((value *)&is);
  value::~value(&val);
  return __return_storage_ptr__;
}

Assistant:

value json_walk(const gc_heap_ptr<global_object>& global, const value& reviver, const object_ptr& holder, const std::wstring_view name) {
    auto& h = global.heap();

    const auto val = holder->get(name);
    if (val.type() == value_type::object) {
        const auto& o = val.object_value();
        if (is_array(o)) {
            const uint32_t len = to_uint32(o->get(L"length"));
            for (uint32_t i = 0; i < len; ++i) {
                const auto is = index_string(i);
                auto new_element = json_walk(global, reviver, o, is);
                if (new_element.type() == value_type::undefined) {
                    o->delete_property(is);
                } else {
                    o->put(string{h, is}, new_element);
                }
            }
        } else {
            const auto keys = o->own_property_names(true);
            for (const auto& p: keys) {
                const std::wstring key{p.view()}; // Keep local copy in case p gets moved during the walk
                auto new_element = json_walk(global, reviver, o, key);
                if (new_element.type() == value_type::undefined) {
                    o->delete_property(p.view());
                } else {
                    o->put(p, new_element);
                }
            }
        }
    }
    return call_function(reviver, value{holder}, { value{string{h, name}}, val });
}